

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-gear.c
# Opt level: O3

uint16_t object_pack_total(player *p,object *obj,_Bool ignore_inscrip,object **first)

{
  ushort uVar1;
  _Bool _Var2;
  char cVar3;
  ulong uVar4;
  object **ppoVar5;
  char cVar6;
  uint16_t uVar7;
  object *obj2;
  
  if (first != (object **)0x0) {
    *first = (object *)0x0;
  }
  obj2 = p->gear;
  uVar7 = 0;
  if (obj2 != (object *)0x0) {
    cVar6 = '\0';
    uVar7 = 0;
    do {
      if (obj2 == obj) {
        uVar1 = (p->body).count;
        if (uVar1 == 0) {
          uVar4 = 0;
LAB_0019437a:
          if ((int)uVar4 < (int)(uint)uVar1) goto LAB_001943f7;
        }
        else {
          ppoVar5 = &((p->body).slots)->obj;
          uVar4 = 0;
          do {
            if (*ppoVar5 == obj) goto LAB_0019437a;
            uVar4 = uVar4 + 1;
            ppoVar5 = ppoVar5 + 4;
          } while ((uint)uVar1 != uVar4);
        }
LAB_0019437e:
        uVar7 = uVar7 + obj2->number;
        if (first != (object **)0x0) {
          cVar3 = gear_to_label(p,obj2);
          if (*first == (object *)0x0) {
LAB_001943f2:
            *first = obj2;
            cVar6 = cVar3;
          }
          else if ((byte)(cVar3 + 0x9fU) < 0x1a) {
            if ((cVar6 == '\0') || ((byte)(cVar6 + 0x9fU) < 0x1a && cVar3 < cVar6))
            goto LAB_001943f2;
          }
          else if (((byte)(cVar3 - 0x30U) < 10) &&
                  (((byte)(cVar6 + 0x9fU) < 0x1a || cVar6 == '\0' ||
                   (cVar3 < cVar6 && (byte)(cVar6 - 0x30U) < 10)))) goto LAB_001943f2;
        }
      }
      else {
        if (ignore_inscrip) {
          _Var2 = object_similar(obj,obj2,OSTACK_PACK);
        }
        else {
          _Var2 = object_stackable(obj,obj2,OSTACK_PACK);
        }
        if (_Var2 != false) goto LAB_0019437e;
      }
LAB_001943f7:
      obj2 = obj2->next;
    } while (obj2 != (object *)0x0);
  }
  return uVar7;
}

Assistant:

uint16_t object_pack_total(struct player *p, const struct object *obj,
		bool ignore_inscrip, struct object **first)
{
	uint16_t total = 0;
	char first_label = '\0';
	struct object *cursor;

	if (first) {
		*first = NULL;
	}
	for (cursor = p->gear; cursor; cursor = cursor->next) {
		bool like;

		if (cursor == obj) {
			/*
			 * object_similar() excludes cursor == obj so if
			 * obj is not equipped, account for it here.
			 */
			like = !object_is_equipped(p->body, obj);
		} else if (ignore_inscrip) {
			like = object_similar(obj, cursor, OSTACK_PACK);
		} else {
			like = object_stackable(obj, cursor, OSTACK_PACK);
		}
		if (like) {
			total += cursor->number;
			if (first) {
				char test_label = gear_to_label(p, cursor);

				if (!*first) {
					*first = cursor;
					first_label = test_label;
				} else {
					if (test_label >= 'a'
							&& test_label <= 'z') {
						if (first_label == '\0'
								|| (first_label >= 'a'
								&& first_label <= 'z'
								&& test_label < first_label)) {
							*first = cursor;
							first_label = test_label;
						}
					} else if (test_label >= '0'
							&& test_label <= '9') {
						if (first_label == '\0'
								|| (first_label >= 'a'
								&& first_label <= 'z')
								|| (first_label >= '0'
								&& first_label <= '9'
								&& test_label < first_label)) {
							*first = cursor;
							first_label = test_label;
						}
					}
				}
			}
		}
	}

	return total;
}